

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint-spbset.c
# Opt level: O3

_Bool Curl_uint_spbset_first(uint_spbset *bset,uint *pfirst)

{
  ulong uVar1;
  long lVar2;
  _Bool _Var3;
  long lVar4;
  uint uVar5;
  curl_uint64_t *pcVar6;
  
  do {
    if (bset == (uint_spbset *)0x0) {
      _Var3 = false;
      uVar5 = 0;
LAB_0015f527:
      *pfirst = uVar5;
      return _Var3;
    }
    lVar4 = 0;
    pcVar6 = (curl_uint64_t *)bset;
    do {
      pcVar6 = pcVar6 + 1;
      uVar1 = *pcVar6;
      if (uVar1 != 0) {
        lVar2 = 0;
        if (uVar1 != 0) {
          for (; (uVar1 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
          }
        }
        uVar5 = ((int)lVar2 + (int)*(ulong *)((long)bset + 0x28)) - (int)lVar4;
        _Var3 = true;
        goto LAB_0015f527;
      }
      lVar4 = lVar4 + -0x40;
    } while (lVar4 != -0x100);
    bset = *(uint_spbset **)bset;
  } while( true );
}

Assistant:

bool Curl_uint_spbset_first(struct uint_spbset *bset, unsigned int *pfirst)
{
  struct uint_spbset_chunk *chunk;
  unsigned int i;

  for(chunk = &bset->head; chunk; chunk = chunk->next) {
    for(i = 0; i < CURL_UINT_SPBSET_CH_SLOTS; ++i) {
      if(chunk->slots[i]) {
        *pfirst = chunk->offset + ((i * 64) + CURL_CTZ64(chunk->slots[i]));
        return TRUE;
      }
    }
  }
  *pfirst = 0; /* give it a defined value even if it should not be used */
  return FALSE;
}